

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

Token * __thiscall
toml::internal::Lexer::parseAsTime(Token *__return_storage_ptr__,Lexer *this,string *str)

{
  char cVar1;
  int iVar2;
  time_t tVar3;
  long lVar4;
  long lVar5;
  string *this_00;
  pointer pcVar6;
  long lVar7;
  double dVar8;
  char pn;
  int n;
  int DD;
  int MM;
  int YYYY;
  double ss;
  int om;
  int oh;
  int mm;
  int hh;
  tm t;
  allocator local_a2;
  char local_a1;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  double local_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  string local_78;
  undefined1 local_58 [56];
  
  pcVar6 = (str->_M_dataplus)._M_p;
  iVar2 = __isoc99_sscanf(pcVar6,"%d-%d-%d%n",&local_94,&local_98,&local_9c,&local_a0);
  if (iVar2 == 3) {
    if (local_98 - 1U < 0xc) {
      if (local_94 < 0x76c) {
        std::__cxx11::string::string((string *)local_58,"Invalid token",(allocator *)&local_78);
        Token::Token(__return_storage_ptr__,ERROR_TOKEN,(string *)local_58);
      }
      else if (pcVar6[local_a0] == 'T') {
        pcVar6 = pcVar6 + (long)local_a0 + 1;
        iVar2 = __isoc99_sscanf(pcVar6,"%d:%d:%lf%n",&local_7c,&local_80,&local_90,&local_a0);
        if (iVar2 == 3) {
          local_58._4_4_ = local_80;
          local_58._0_4_ = (int)local_90;
          local_58._8_4_ = local_7c;
          local_58._12_4_ = local_9c;
          local_58._16_4_ = local_98 + -1;
          local_58._20_4_ = local_94 + -0x76c;
          tVar3 = timegm((tm *)local_58);
          local_90 = local_90 - (double)(int)local_90;
          dVar8 = round(local_90 * 1000000.0);
          lVar7 = (long)dVar8 * 1000 + tVar3 * 1000000000;
          cVar1 = pcVar6[local_a0];
          if (cVar1 == 'Z') {
            cVar1 = (pcVar6 + local_a0)[1];
          }
          if (cVar1 == '\0') {
            __return_storage_ptr__->type_ = TIME;
            (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->str_value_).field_2;
            (__return_storage_ptr__->str_value_)._M_string_length = 0;
            (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
            (__return_storage_ptr__->time_value_).__d.__r = lVar7;
            return __return_storage_ptr__;
          }
          iVar2 = __isoc99_sscanf(pcVar6 + local_a0,"%c%d:%d",&local_a1,&local_84,&local_88);
          if (iVar2 == 3) {
            if (local_a1 == '+') {
              lVar4 = -60000000000;
              lVar5 = -3600000000000;
LAB_0016ab9c:
              __return_storage_ptr__->type_ = TIME;
              (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->str_value_).field_2;
              (__return_storage_ptr__->str_value_)._M_string_length = 0;
              (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
              (__return_storage_ptr__->time_value_).__d.__r =
                   local_88 * lVar4 + local_84 * lVar5 + lVar7;
              return __return_storage_ptr__;
            }
            if (local_a1 == '-') {
              lVar4 = 60000000000;
              lVar5 = 3600000000000;
              goto LAB_0016ab9c;
            }
            std::__cxx11::string::string((string *)&local_78,"Invalid token",&local_a2);
            Token::Token(__return_storage_ptr__,ERROR_TOKEN,&local_78);
          }
          else {
            std::__cxx11::string::string((string *)&local_78,"Invalid token",&local_a2);
            Token::Token(__return_storage_ptr__,ERROR_TOKEN,&local_78);
          }
          this_00 = &local_78;
          goto LAB_0016a963;
        }
        std::__cxx11::string::string((string *)local_58,"Invalid token",(allocator *)&local_78);
        Token::Token(__return_storage_ptr__,ERROR_TOKEN,(string *)local_58);
      }
      else {
        if (pcVar6[local_a0] == '\0') {
          local_58._0_8_ = (pointer)0x0;
          local_58._8_4_ = 0;
          local_58._12_4_ = local_9c;
          local_58._20_4_ = local_94 + -0x76c;
          local_58._16_4_ = local_98 - 1U;
          tVar3 = timegm((tm *)local_58);
          __return_storage_ptr__->type_ = TIME;
          (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->str_value_).field_2;
          (__return_storage_ptr__->str_value_)._M_string_length = 0;
          (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->time_value_).__d.__r = tVar3 * 1000000000;
          return __return_storage_ptr__;
        }
        std::__cxx11::string::string((string *)local_58,"Invalid token",(allocator *)&local_78);
        Token::Token(__return_storage_ptr__,ERROR_TOKEN,(string *)local_58);
      }
    }
    else {
      std::__cxx11::string::string((string *)local_58,"Invalid token",(allocator *)&local_78);
      Token::Token(__return_storage_ptr__,ERROR_TOKEN,(string *)local_58);
    }
  }
  else {
    std::__cxx11::string::string((string *)local_58,"Invalid token",(allocator *)&local_78);
    Token::Token(__return_storage_ptr__,ERROR_TOKEN,(string *)local_58);
  }
  this_00 = (string *)local_58;
LAB_0016a963:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

inline Token Lexer::parseAsTime(const std::string& str)
{
    const char* s = str.c_str();

    int n;
    int YYYY, MM, DD;
#if defined(_MSC_VER)
    if (sscanf_s(s, "%d-%d-%d%n", &YYYY, &MM, &DD, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#else
    if (sscanf(s, "%d-%d-%d%n", &YYYY, &MM, &DD, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#endif

    if (!(1 <= MM && MM <= 12)) {
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
    }
    if (YYYY < 1900) {
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
    }

    if (s[n] == '\0') {
        std::tm t;
        t.tm_sec = 0;
        t.tm_min = 0;
        t.tm_hour = 0;
        t.tm_mday = DD;
        t.tm_mon = MM - 1;
        t.tm_year = YYYY - 1900;
        auto tp = std::chrono::system_clock::from_time_t(timegm(&t));
        return Token(TokenType::TIME, tp);
    }

    if (s[n] != 'T')
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));

    s = s + n + 1;

    int hh, mm;
    double ss; // double for fraction
#if defined(_MSC_VER)
    if (sscanf_s(s, "%d:%d:%lf%n", &hh, &mm, &ss, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#else
    if (sscanf(s, "%d:%d:%lf%n", &hh, &mm, &ss, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#endif

    std::tm t;
    t.tm_sec = static_cast<int>(ss);
    t.tm_min = mm;
    t.tm_hour = hh;
    t.tm_mday = DD;
    t.tm_mon = MM - 1;
    t.tm_year = YYYY - 1900;
    auto tp = std::chrono::system_clock::from_time_t(timegm(&t));
    ss -= static_cast<int>(ss);
    // TODO(mayah): workaround GCC 4.9.3 on cygwin does not have std::round, but round().
    tp += std::chrono::microseconds(static_cast<std::int64_t>(round(ss * 1000000)));

    if (s[n] == '\0')
        return Token(TokenType::TIME, tp);

    if (s[n] == 'Z' && s[n + 1] == '\0')
        return Token(TokenType::TIME, tp);

    s = s + n;
    // offset
    // [+/-]%d:%d
    char pn;
    int oh, om;
#if defined(_MSC_VER)
    if (sscanf_s(s, "%c%d:%d", &pn, static_cast<unsigned>(sizeof(pn)), &oh, &om) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#else
    if (sscanf(s, "%c%d:%d", &pn, &oh, &om) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#endif

    if (pn != '+' && pn != '-')
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));

    if (pn == '+') {
        tp -= std::chrono::hours(oh);
        tp -= std::chrono::minutes(om);
    } else {
        tp += std::chrono::hours(oh);
        tp += std::chrono::minutes(om);
    }

    return Token(TokenType::TIME, tp);
}